

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall Js::ByteCodeWriter::Data::Copy(Data *this,Recycler *alloc,ByteBlock **finalBlock)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ByteBlock *this_00;
  byte *dst;
  DataChunk *pDVar5;
  size_t sizeInBytes;
  size_t count;
  
  if (finalBlock == (ByteBlock **)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xcfa,"(finalBlock != nullptr)","Must have valid storage");
    if (!bVar3) {
LAB_0089a21f:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  uVar1 = this->currentOffset;
  sizeInBytes = (size_t)uVar1;
  if (sizeInBytes == 0) {
    this_00 = (ByteBlock *)0x0;
  }
  else {
    this_00 = ByteBlock::New(alloc,(byte *)0x0,uVar1);
    pDVar5 = this->head;
    dst = ByteBlock::GetBuffer(this_00);
    count = (size_t)pDVar5->byteSize;
    if (pDVar5->byteSize < uVar1) {
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        js_memcpy_s(dst,sizeInBytes,pDVar5->buffer,count);
        uVar1 = pDVar5->byteSize;
        pDVar5 = pDVar5->nextChunk;
        if (pDVar5 == (DataChunk *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar4 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0xd15,"(currentChunk)",
                                      "We are copying more data than we have!");
          if (!bVar3) goto LAB_0089a21f;
          *puVar4 = 0;
        }
        sizeInBytes = sizeInBytes - uVar1;
        dst = dst + uVar1;
        count = (size_t)pDVar5->byteSize;
      } while (count < sizeInBytes);
    }
    js_memcpy_s(dst,sizeInBytes,pDVar5->buffer,sizeInBytes);
  }
  *finalBlock = this_00;
  return;
}

Assistant:

void ByteCodeWriter::Data::Copy(Recycler* alloc, ByteBlock ** finalBlock)
    {
        AssertMsg(finalBlock != nullptr, "Must have valid storage");

        uint cbFinalData = GetCurrentOffset();
        if (cbFinalData == 0)
        {
            *finalBlock = nullptr;
        }
        else
        {
            ByteBlock* finalByteCodeBlock = ByteBlock::New(alloc, /*initialContent*/nullptr, cbFinalData);

            DataChunk* currentChunk = head;
            size_t bytesLeftToCopy = cbFinalData;
            byte* currentDest = finalByteCodeBlock->GetBuffer();
            while (true)
            {
                if (bytesLeftToCopy <= currentChunk->GetSize())
                {
                    js_memcpy_s(currentDest, bytesLeftToCopy, currentChunk->GetBuffer(), bytesLeftToCopy);
                    break;
                }

                js_memcpy_s(currentDest, bytesLeftToCopy, currentChunk->GetBuffer(), currentChunk->GetSize());
                bytesLeftToCopy -= currentChunk->GetSize();
                currentDest += currentChunk->GetSize();

                currentChunk = currentChunk->nextChunk;
                AssertMsg(currentChunk, "We are copying more data than we have!");
            }

            *finalBlock = finalByteCodeBlock;
        }
    }